

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O3

void __thiscall
Imf_3_2::TiledRgbaOutputFile::TiledRgbaOutputFile
          (TiledRgbaOutputFile *this,char *name,int tileXSize,int tileYSize,LevelMode mode,
          LevelRoundingMode rmode,Box2i *displayWindow,Box2i *dataWindow,RgbaChannels rgbaChannels,
          float pixelAspectRatio,V2f *screenWindowCenter,float screenWindowWidth,LineOrder lineOrder
          ,Compression compression,int numThreads)

{
  TiledOutputFile *this_00;
  ToYa *this_01;
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  Header local_78;
  TileDescription local_40;
  
  this->_vptr_TiledRgbaOutputFile = (_func_int **)&PTR__TiledRgbaOutputFile_003d7550;
  this->_outputFile = (TiledOutputFile *)0x0;
  this->_toYa = (ToYa *)0x0;
  iVar2 = -(uint)((dataWindow->max).x < (dataWindow->min).x);
  iVar3 = -(uint)((dataWindow->max).y < (dataWindow->min).y);
  auVar1._4_4_ = iVar2;
  auVar1._0_4_ = iVar2;
  auVar1._8_4_ = iVar3;
  auVar1._12_4_ = iVar3;
  iVar2 = movmskpd(0x3d7550,auVar1);
  if (iVar2 != 0) {
    dataWindow = displayWindow;
  }
  Header::Header(&local_78,displayWindow,dataWindow,pixelAspectRatio,screenWindowCenter,
                 screenWindowWidth,lineOrder,compression);
  anon_unknown_22::insertChannels(&local_78,rgbaChannels,name);
  local_40.xSize = tileXSize;
  local_40.ySize = tileYSize;
  local_40.mode = mode;
  local_40.roundingMode = rmode;
  Header::setTileDescription(&local_78,&local_40);
  this_00 = (TiledOutputFile *)operator_new(0x20);
  TiledOutputFile::TiledOutputFile(this_00,name,&local_78,numThreads);
  this->_outputFile = this_00;
  if ((rgbaChannels & WRITE_Y) != 0) {
    this_01 = (ToYa *)operator_new(0x50);
    ToYa::ToYa(this_01,this_00,rgbaChannels);
    this->_toYa = this_01;
  }
  Header::~Header(&local_78);
  return;
}

Assistant:

TiledRgbaOutputFile::TiledRgbaOutputFile (
    const char                    name[],
    int                           tileXSize,
    int                           tileYSize,
    LevelMode                     mode,
    LevelRoundingMode             rmode,
    const IMATH_NAMESPACE::Box2i& displayWindow,
    const IMATH_NAMESPACE::Box2i& dataWindow,
    RgbaChannels                  rgbaChannels,
    float                         pixelAspectRatio,
    const IMATH_NAMESPACE::V2f    screenWindowCenter,
    float                         screenWindowWidth,
    LineOrder                     lineOrder,
    Compression                   compression,
    int                           numThreads)
    : _outputFile (0), _toYa (0)
{
    Header hd (
        displayWindow,
        dataWindow.isEmpty () ? displayWindow : dataWindow,
        pixelAspectRatio,
        screenWindowCenter,
        screenWindowWidth,
        lineOrder,
        compression);

    insertChannels (hd, rgbaChannels, name);
    hd.setTileDescription (TileDescription (tileXSize, tileYSize, mode, rmode));
    _outputFile = new TiledOutputFile (name, hd, numThreads);

    if (rgbaChannels & WRITE_Y) _toYa = new ToYa (*_outputFile, rgbaChannels);
}